

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::OnReturnCallExpr(Validator *this,ReturnCallExpr *expr)

{
  bool bVar1;
  Result result;
  Func *local_28;
  Func *callee;
  ReturnCallExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)32>).super_Expr.loc;
  callee = (Func *)expr;
  expr_local = (ReturnCallExpr *)this;
  result = CheckFuncVar(this,&expr->var,&local_28);
  bVar1 = Succeeded(result);
  if (bVar1) {
    TypeChecker::OnReturnCall
              (&this->typechecker_,&(local_28->decl).sig.param_types,
               &(local_28->decl).sig.result_types);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnReturnCallExpr(ReturnCallExpr* expr) {
  expr_loc_ = &expr->loc;
  const Func* callee;
  if (Succeeded(CheckFuncVar(&expr->var, &callee))) {
    typechecker_.OnReturnCall(callee->decl.sig.param_types,
                        callee->decl.sig.result_types);
  }
  return Result::Ok;
}